

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnDateTime::ColumnDateTime(ColumnDateTime *this,string *timezone)

{
  string *in_RSI;
  undefined8 *in_RDI;
  string *this_00;
  Column *in_stack_ffffffffffffffb0;
  string local_40 [8];
  string *in_stack_ffffffffffffffc8;
  
  this_00 = local_40;
  std::__cxx11::string::string(this_00,in_RSI);
  Type::CreateDateTime(in_stack_ffffffffffffffc8);
  Column::Column(in_stack_ffffffffffffffb0,(TypeRef *)this_00);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x1ef8b3);
  std::__cxx11::string::~string(local_40);
  *in_RDI = &PTR__ColumnDateTime_0029f670;
  std::make_shared<clickhouse::ColumnVector<unsigned_int>>();
  return;
}

Assistant:

ColumnDateTime::ColumnDateTime(std::string timezone)
    : Column(Type::CreateDateTime(std::move(timezone)))
    , data_(std::make_shared<ColumnUInt32>())
{
}